

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O0

shared_ptr<helics::Core>
helics::CoreFactory::FindOrCreate
          (CoreType type,string_view coreName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  string_view name;
  string_view name_00;
  string_view name_01;
  bool bVar1;
  undefined1 uVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  size_t in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  __shared_ptr *in_RDI;
  shared_ptr<helics::Core> sVar4;
  shared_ptr<helics::Core> *core;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  undefined8 in_stack_ffffffffffffff48;
  CoreType type_00;
  size_t in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  undefined1 local_90 [28];
  CoreType in_stack_ffffffffffffff8c;
  shared_ptr<helics::Core> *in_stack_ffffffffffffff90;
  
  type_00 = (CoreType)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  name._M_str = in_stack_ffffffffffffff58;
  name._M_len = in_stack_ffffffffffffff50;
  findCore(name);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RDI);
  _Var3._M_pi = extraout_RDX;
  if (!bVar1) {
    name_00._M_str = in_stack_ffffffffffffff58;
    name_00._M_len = in_stack_ffffffffffffff50;
    makeCore(type_00,name_00);
    std::shared_ptr<helics::Core>::operator=
              ((shared_ptr<helics::Core> *)
               CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
               (shared_ptr<helics::Core> *)in_stack_ffffffffffffff08);
    std::shared_ptr<helics::Core>::~shared_ptr((shared_ptr<helics::Core> *)0x4fa16c);
    this = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x4fa176);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
             in_stack_ffffffffffffff08);
    (*(code *)(this->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p)(this,local_90);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(this);
    uVar2 = registerCore(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    _Var3._M_pi = extraout_RDX_00;
    if (!(bool)uVar2) {
      name_01._M_str = in_stack_ffffffffffffff58;
      name_01._M_len = in_RCX;
      findCore(name_01);
      std::shared_ptr<helics::Core>::operator=
                ((shared_ptr<helics::Core> *)CONCAT17(uVar2,in_stack_ffffffffffffff10),
                 (shared_ptr<helics::Core> *)in_stack_ffffffffffffff08);
      std::shared_ptr<helics::Core>::~shared_ptr((shared_ptr<helics::Core> *)0x4fa20f);
      std::__shared_ptr::operator_cast_to_bool(in_RDI);
      _Var3._M_pi = extraout_RDX_01;
    }
  }
  sVar4.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi
  ;
  sVar4.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)in_RDI
  ;
  return (shared_ptr<helics::Core>)
         sVar4.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Core>
    FindOrCreate(CoreType type, std::string_view coreName, std::vector<std::string> args)
{
    std::shared_ptr<Core> core = findCore(coreName);
    if (core) {
        return core;
    }
    core = makeCore(type, coreName);
    core->configureFromVector(std::move(args));

    if (!registerCore(core, type)) {
        core = findCore(coreName);
        if (core) {
            return core;
        }
    }

    return core;
}